

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserMhapTest_CompressedFormatError_Test::
~BioparserMhapTest_CompressedFormatError_Test(BioparserMhapTest_CompressedFormatError_Test *this)

{
  BioparserMhapTest::~BioparserMhapTest(&this->super_BioparserMhapTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, CompressedFormatError) {
  Setup("sample.paf.gz");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::MhapParser] error: invalid file format");
  }
}